

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O0

void __thiscall
wasm::ParallelFuncCastEmulation::~ParallelFuncCastEmulation(ParallelFuncCastEmulation *this)

{
  ParallelFuncCastEmulation *this_local;
  
  ~ParallelFuncCastEmulation(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }